

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

int rtosc::enum_key(MetaContainer meta,char *value)

{
  int iVar1;
  char *pcVar2;
  char *__haystack;
  MetaIterator __begin1;
  MetaIterator local_50;
  MetaIterator local_40;
  
  if ((meta.str_ptr != (char *)0x0) && (*meta.str_ptr == ':')) {
    meta.str_ptr = meta.str_ptr + 1;
  }
  Port::MetaIterator::MetaIterator(&local_40,meta.str_ptr);
  __haystack = local_40.title;
  local_50.title = local_40.title;
  local_50.value = local_40.value;
  Port::MetaIterator::MetaIterator(&local_40,(char *)0x0);
  if (__haystack != local_40.title) {
    do {
      pcVar2 = strstr(__haystack,"map ");
      if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(local_50.value,value), iVar1 == 0)) {
        iVar1 = atoi(__haystack + 4);
        return iVar1;
      }
      Port::MetaIterator::operator++(&local_50);
      __haystack = local_50.title;
    } while (local_50.title != local_40.title);
  }
  return -0x80000000;
}

Assistant:

int rtosc::enum_key(Port::MetaContainer meta, const char* value)
{
    int result = std::numeric_limits<int>::min();

    for(auto m:meta)
    if(strstr(m.title, "map "))
    if(!strcmp(m.value, value))
    {
        result = atoi(m.title+4);
        break;
    }

    assert(!meta["min"] || result >= atoi(meta["min"]));
    assert(!meta["max"] || result <= atoi(meta["max"]));

    return result;
}